

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9HashmapCmp(jx9_hashmap *pLeft,jx9_hashmap *pRight,int bStrict)

{
  int iVar1;
  sxi32 sVar2;
  uint uVar3;
  jx9_hashmap_node *pLeft_00;
  jx9_hashmap_node *pRe;
  jx9_hashmap_node *local_30;
  
  if (pLeft == pRight) {
    return 0;
  }
  uVar3 = pLeft->nEntry;
  if (uVar3 == pRight->nEntry) {
    pLeft_00 = pLeft->pFirst;
    local_30 = (jx9_hashmap_node *)0x0;
    if (uVar3 != 0) {
      do {
        if (pLeft_00->iType == 1) {
          iVar1 = HashmapLookupIntKey(pRight,(pLeft_00->xKey).iKey,&local_30);
        }
        else {
          iVar1 = HashmapLookupBlobKey
                            (pRight,(pLeft_00->xKey).sKey.pBlob,(pLeft_00->xKey).sKey.nByte,
                             &local_30);
        }
        if (iVar1 != 0) {
          return 1;
        }
        if ((bStrict != 0) && (pLeft_00->iType != local_30->iType)) {
          return 1;
        }
        sVar2 = HashmapNodeCmp(pLeft_00,local_30,bStrict);
        if (sVar2 != 0) {
          return sVar2;
        }
        pLeft_00 = pLeft_00->pPrev;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    uVar3 = 0;
  }
  else {
    uVar3 = (pRight->nEntry < uVar3) - 1 | 1;
  }
  return uVar3;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapCmp(
	jx9_hashmap *pLeft,  /* Left hashmap */
	jx9_hashmap *pRight, /* Right hashmap */
	int bStrict          /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pLe, *pRe;
	sxi32 rc;
	sxu32 n;
	if( pLeft == pRight ){
		/* Same hashmap instance. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return 0;
	}
	if( pLeft->nEntry != pRight->nEntry ){
		/* Must have the same number of entries */
		return pLeft->nEntry > pRight->nEntry ? 1 : -1;
	}
	/* Point to the first inserted entry of the left hashmap */
	pLe = pLeft->pFirst;
	pRe = 0; /* cc warning */
	/* Perform the comparison */
	n = pLeft->nEntry;
	for(;;){
		if( n < 1 ){
			break;
		}
		if( pLe->iType == HASHMAP_INT_NODE){
			/* Int key */
			rc = HashmapLookupIntKey(&(*pRight), pLe->xKey.iKey, &pRe);
		}else{
			SyBlob *pKey = &pLe->xKey.sKey;
			/* Blob key */
			rc = HashmapLookupBlobKey(&(*pRight), SyBlobData(pKey), SyBlobLength(pKey), &pRe);
		}
		if( rc != SXRET_OK ){
			/* No such entry in the right side */
			return 1;
		}
		rc = 0;
		if( bStrict ){
			/* Make sure, the keys are of the same type */
			if( pLe->iType != pRe->iType ){
				rc = 1;
			}
		}
		if( !rc ){
			/* Compare nodes */
			rc = HashmapNodeCmp(pLe, pRe, bStrict);
		}
		if( rc != 0 ){
			/* Nodes key/value differ */
			return rc;
		}
		/* Point to the next entry */
		pLe = pLe->pPrev; /* Reverse link */
		n--;
	}
	return 0; /* Hashmaps are equals */
}